

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageLoadTotals(Fts5Storage *p,int bCache)

{
  int iVar1;
  Fts5Index *p_00;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  Fts5Data *p_01;
  long lVar5;
  u64 *v;
  
  if (p->bTotalsValid != 0) {
    return 0;
  }
  p_00 = p->pIndex;
  v = (u64 *)p->aTotalSize;
  iVar1 = p_00->pConfig->nCol;
  p->nTotalRow = 0;
  memset(v,0,(long)iVar1 * 8);
  p_01 = fts5DataRead(p_00,1);
  if ((p_00->rc == 0) && (p_01->nn != 0)) {
    bVar3 = sqlite3Fts5GetVarint(p_01->p,(u64 *)&p->nTotalRow);
    uVar4 = (uint)bVar3;
    if (((int)(uint)bVar3 < p_01->nn) && (0 < iVar1)) {
      lVar5 = 1;
      do {
        bVar3 = sqlite3Fts5GetVarint(p_01->p + uVar4,v);
        uVar4 = bVar3 + uVar4;
        if (p_01->nn <= (int)uVar4) break;
        v = v + 1;
        bVar2 = lVar5 < iVar1;
        lVar5 = lVar5 + 1;
      } while (bVar2);
    }
  }
  sqlite3_free(p_01);
  iVar1 = p_00->rc;
  p_00->rc = 0;
  p->bTotalsValid = bCache;
  return iVar1;
}

Assistant:

static int fts5StorageLoadTotals(Fts5Storage *p, int bCache){
  int rc = SQLITE_OK;
  if( p->bTotalsValid==0 ){
    rc = sqlite3Fts5IndexGetAverages(p->pIndex, &p->nTotalRow, p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return rc;
}